

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

bool __thiscall libwebvtt::Time::operator<(Time *this,Time *rhs)

{
  Time *rhs_local;
  Time *this_local;
  
  if (this->hours < rhs->hours) {
    this_local._7_1_ = true;
  }
  else if (rhs->hours < this->hours) {
    this_local._7_1_ = false;
  }
  else if (this->minutes < rhs->minutes) {
    this_local._7_1_ = true;
  }
  else if (rhs->minutes < this->minutes) {
    this_local._7_1_ = false;
  }
  else if (this->seconds < rhs->seconds) {
    this_local._7_1_ = true;
  }
  else if (rhs->seconds < this->seconds) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = this->milliseconds < rhs->milliseconds;
  }
  return this_local._7_1_;
}

Assistant:

bool Time::operator<(const Time& rhs) const {
  if (hours < rhs.hours)
    return true;

  if (hours > rhs.hours)
    return false;

  if (minutes < rhs.minutes)
    return true;

  if (minutes > rhs.minutes)
    return false;

  if (seconds < rhs.seconds)
    return true;

  if (seconds > rhs.seconds)
    return false;

  return (milliseconds < rhs.milliseconds);
}